

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_extend(HSQUIRRELVM v)

{
  SQArray *this;
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  long lVar5;
  SQRESULT local_40;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  if (((pSVar2->super_SQObject)._flags & 1) != 0) {
    SVar4 = sq_throwerror(v,"Cannot modify immutable object");
    return SVar4;
  }
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  this = (pSVar2->super_SQObject)._unVal.pArray;
  SVar3 = sq_gettop(v);
  bVar1 = 1 < SVar3;
  if (1 < SVar3) {
    lVar5 = 1;
    do {
      pSVar2 = SQVM::GetAt(v,v->_stackbase + lVar5);
      if ((pSVar2->super_SQObject)._type != OT_ARRAY) {
        local_40 = sq_throwerror(v,"only arrays can be used to extend array");
        break;
      }
      SQArray::Extend(this,(pSVar2->super_SQObject)._unVal.pArray);
      bVar1 = lVar5 < SVar3 + -1;
      lVar5 = lVar5 + 1;
    } while (SVar3 != lVar5);
  }
  if (!bVar1) {
    sq_pop(v,SVar3 + -1);
    local_40 = 1;
  }
  return local_40;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *arr = _array(stack_get(v, 1));
    SQInteger n = sq_gettop(v)-1;
    for (SQInteger i=0; i<n; ++i) {
        SQObject &o=stack_get(v,2+i);
        if (sq_type(o) != OT_ARRAY)
            return sq_throwerror(v, _SC("only arrays can be used to extend array"));
        arr->Extend(_array(o));
    }
    sq_pop(v,n);
    return 1;
}